

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O0

double gammacdf(double x,double k,double th)

{
  double dVar1;
  double t;
  double oup;
  double th_local;
  double k_local;
  double x_local;
  
  if ((0.0 < k) && (0.0 < th)) {
    k_local = x;
    if (x <= 0.0) {
      k_local = 0.0;
    }
    dVar1 = pgamma(k_local / th,k);
    return dVar1;
  }
  printf("Gamma Distribution parameters must be positive and real.");
  exit(1);
}

Assistant:

double gammacdf(double x, double k, double th) {
	double oup,t;
	
	if (k <= 0. || th <= 0.) {
		printf("Gamma Distribution parameters must be positive and real.");
		exit(1);
	}
	
	if (x <= 0.) {
		x = 0.;
	}
	
	t = x/th;
	
	oup = pgamma(t,k);
	
	return oup;
}